

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

void __thiscall BVStatic<4096UL>::ClearRange(BVStatic<4096UL> *this,BVIndex index,uint length)

{
  BVIndex index_00;
  BVUnit *pBStack_20;
  uint offset;
  BVUnit *bvUnit;
  uint length_local;
  BVIndex index_local;
  BVStatic<4096UL> *this_local;
  
  AssertRange(this,index);
  AssertRange(this,(index + length) - 1);
  pBStack_20 = BitsFromIndex(this,index);
  index_00 = BVUnitT<unsigned_long>::Offset(index);
  if (index_00 + length < 0x41) {
    BVUnitT<unsigned_long>::ClearRange(pBStack_20,index_00,length);
  }
  else {
    BVUnitT<unsigned_long>::ClearRange(pBStack_20,index_00,0x40 - index_00);
    for (bvUnit._0_4_ = length - (0x40 - index_00); pBStack_20 = pBStack_20 + 1, 0x3f < (uint)bvUnit
        ; bvUnit._0_4_ = (uint)bvUnit - 0x40) {
      BVUnitT<unsigned_long>::ClearAll(pBStack_20);
    }
    if ((uint)bvUnit != 0) {
      BVUnitT<unsigned_long>::ClearRange(pBStack_20,0,(uint)bvUnit);
    }
  }
  return;
}

Assistant:

void ClearRange(const BVIndex index, uint length)
    {
        AssertRange(index);
        AssertRange(index + length - 1);

        BVUnit * bvUnit = BitsFromIndex(index);
        uint offset = BVUnit::Offset(index);

        if (offset + length <= BVUnit::BitsPerWord)
        {
            // Bit range is in a single word
            return bvUnit->ClearRange(offset, length);
        }

        // Bit range spans words.
        // Clear the first word, from start offset to end of word
        bvUnit->ClearRange(offset, (BVUnit::BitsPerWord - offset));

        bvUnit++;
        length -= (BVUnit::BitsPerWord - offset);

        // Set entire words until we are at the last word
        while (length >= BVUnit::BitsPerWord)
        {
            bvUnit->ClearAll();

            bvUnit++;
            length -= BVUnit::BitsPerWord;
        }

        // Set last word (unless we already ended on a word boundary)
        if (length > 0)
        {
            bvUnit->ClearRange(0, length);
        }
    }